

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_view.cpp
# Opt level: O2

bool ViewHdd(string *path,Range range)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  exception *this;
  long lVar7;
  int iVar8;
  long sector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  Range range_local;
  MEMORY mem;
  shared_ptr<HDD> hdd;
  
  range_local._8_8_ = range._8_8_;
  range_local._0_8_ = range._0_8_;
  HDD::OpenDisk((HDD *)&hdd,path);
  if (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    Error("open");
  }
  bVar2 = Range::empty(&range_local);
  if (!bVar2) {
    iVar3 = Range::cyls(&range_local);
    if (iVar3 != 1) {
LAB_0015da1b:
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[34]>
                (this,(char (*) [34])"HDD view ranges are not supported");
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = Range::heads(&range_local);
    if (iVar3 != 1) goto LAB_0015da1b;
  }
  mem.size = (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sector_size;
  mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
  mem.pb = AllocMem(mem.size);
  lVar1 = opt.sectors;
  iVar3 = range_local.cyl_begin;
  iVar8 = range_local.head_begin;
  lVar7 = 0;
  if (0 < opt.sectors) {
    lVar7 = opt.sectors;
  }
  bVar2 = Range::empty(&range_local);
  sector = lVar7;
  if (bVar2) {
LAB_0015d851:
    if ((hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->total_sectors <= sector) {
      util::fmt_abi_cxx11_(&bStack_88,"LBA value out of drive range (%u sectors).\n");
      util::operator<<((LogHelper *)&util::cout,&bStack_88);
      goto LAB_0015d954;
    }
    bVar2 = HDD::Seek(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr,sector);
    if (bVar2) {
      iVar4 = HDD::Read(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr,mem.pb,1,
                        false);
      if (iVar4 != 0) {
        bVar2 = Range::empty(&range_local);
        if (bVar2) {
          util::fmt_abi_cxx11_(&bStack_88,"LBA Sector %u (%u bytes):\n\n",sector);
          util::operator<<((LogHelper *)&util::cout,&bStack_88);
        }
        else {
          pcVar5 = CylStr(iVar3);
          pcVar6 = HeadStr(iVar8);
          util::fmt_abi_cxx11_
                    (&bStack_88,"Cyl %s Head %s Sector %u (LBA %s):\n",pcVar5,pcVar6,lVar7,sector);
          util::operator<<((LogHelper *)&util::cout,&bStack_88);
        }
        std::__cxx11::string::~string((string *)&bStack_88);
        iVar3 = opt.bytes_begin;
        if (opt.bytes_begin < 1) {
          iVar3 = 0;
        }
        iVar8 = opt.bytes_end;
        if (mem.size < opt.bytes_end) {
          iVar8 = mem.size;
        }
        if (opt.bytes_end < 0) {
          iVar8 = mem.size;
        }
        bVar2 = true;
        util::hex_dump<unsigned_char*>(mem.pb,mem.pb + iVar8,iVar3,(colour *)0x0,0x10);
        goto LAB_0015d96c;
      }
    }
    Error("read");
  }
  else {
    iVar4 = (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->heads;
    if (((iVar8 < iVar4 &&
          iVar3 < (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cyls) &&
        (0 < lVar1)) &&
       (lVar7 <= (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sectors)) {
      sector = lVar7 + (long)(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             sectors * (long)(iVar4 * iVar3 + iVar8) + -1;
      goto LAB_0015d851;
    }
    util::fmt_abi_cxx11_
              (&bStack_88,"Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
               (ulong)((hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cyls - 1),
               (ulong)(iVar4 - 1),
               (ulong)(uint)(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            sectors);
    util::operator<<((LogHelper *)&util::cout,&bStack_88);
LAB_0015d954:
    std::__cxx11::string::~string((string *)&bStack_88);
  }
  bVar2 = false;
LAB_0015d96c:
  MEMORY::~MEMORY(&mem);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar2;
}

Assistant:

bool ViewHdd(const std::string& path, Range range)
{
    auto hdd = HDD::OpenDisk(path);
    if (!hdd)
        Error("open");

    if (!range.empty() && (range.cyls() != 1 || range.heads() != 1))
        throw util::exception("HDD view ranges are not supported");

    MEMORY mem(hdd->sector_size);

    auto cyl = range.cyl_begin;
    auto head = range.head_begin;
    auto sector = (opt.sectors < 0) ? 0 : opt.sectors;
    auto lba_sector = sector;

    if (!range.empty())
    {
        if (cyl >= hdd->cyls || head >= hdd->heads || sector > hdd->sectors || !sector)
        {
            util::cout << util::fmt("Invalid CHS address for drive (Cyl 0-%d, Head 0-%u, Sector 1-%u)\n",
                hdd->cyls - 1, hdd->heads - 1, hdd->sectors);
            return false;
        }

        // Convert CHS address to LBA
        lba_sector = (cyl * hdd->heads + head) * hdd->sectors + (sector - 1);
    }

    if (lba_sector >= hdd->total_sectors)
        util::cout << util::fmt("LBA value out of drive range (%u sectors).\n", hdd->total_sectors);
    else if (!hdd->Seek(lba_sector) || !hdd->Read(mem, 1))
        Error("read");
    else
    {
        if (!range.empty())
            util::cout << util::fmt("Cyl %s Head %s Sector %u (LBA %s):\n", CylStr(cyl), HeadStr(head), sector, lba_sector);
        else
            util::cout << util::fmt("LBA Sector %u (%u bytes):\n\n", lba_sector, mem.size);

        auto show_begin = std::max(opt.bytes_begin, 0);
        auto show_end = (opt.bytes_end < 0) ? mem.size :
            std::min(opt.bytes_end, mem.size);
        util::hex_dump(mem.pb, mem.pb + show_end, show_begin);
        return true;
    }

    return false;
}